

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O0

char * zt_opt_get_value(int argn,int defn,char **argv,zt_opt_def_t *def,int *args_consumed,
                       zt_opt_error error)

{
  char cVar1;
  char *__s1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  undefined4 *in_R8;
  code *in_R9;
  char *lopt;
  char *result;
  char *pp;
  char *p;
  char *local_40;
  char *local_38;
  char *local_30;
  
  local_30 = *(char **)(in_RDX + (long)in_EDI * 8);
  local_40 = (char *)0x0;
  __s1 = *(char **)(in_RCX + (long)in_ESI * 0x30 + 8);
  *in_R8 = 0;
  for (; *local_30 == '-'; local_30 = local_30 + 1) {
  }
  local_38 = local_30;
  do {
    if (*local_38 == '=') {
      local_40 = local_38 + 1;
      break;
    }
    cVar1 = *local_38;
    local_38 = local_38 + 1;
  } while (cVar1 != '\0');
  if (local_40 == (char *)0x0) {
    iVar2 = strcmp(__s1,local_30);
    if (iVar2 == 0) {
      local_40 = *(char **)(in_RDX + (long)(in_EDI + 1) * 8);
      *in_R8 = 1;
    }
    else {
      local_40 = local_30 + 1;
      if (*local_40 == '\0') {
        local_40 = *(char **)(in_RDX + (long)(in_EDI + 1) * 8);
        *in_R8 = 1;
      }
    }
  }
  if (local_40 == (char *)0x0) {
    (*in_R9)(0x16,"while processing arg \'%s\'",*(undefined8 *)(in_RDX + (long)in_EDI * 8));
  }
  return local_40;
}

Assistant:

char *
zt_opt_get_value(int argn, int defn, char ** argv, zt_opt_def_t * def, int *args_consumed, zt_opt_error error) {
    char * p      = argv[argn];
    char * pp     = NULL;
    char * result = NULL;
    char * lopt   = def[defn].lopt;

    *args_consumed = 0;

    /* skip past any leading '-' */
    while(*p == '-') { p++; }

    pp = p;
    do {
        if (*pp == '=') {
            result = ++pp;
            break;
        }
    } while (*pp++);

    if (!result) {
        pp = p;
        /* there was no '=' embedded
         * try matching the long opt name
         */
        if (strcmp(lopt, pp) == 0) {
            result = argv[argn + 1]; /* default to the next option */
            *args_consumed = 1;
        } else {
            /* short opt */
            pp++;
            if(*pp) {
                result = pp;
            } else {
                result = argv[argn + 1];
                *args_consumed = 1;
            }
        }
    }

    if (!result) {
        error(EINVAL, "while processing arg '%s'", argv[argn]);
    }

    return result;
}